

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O0

int ncnn::conv3x3s1_winograd43_int8(Mat *bottom_blob,Mat *top_blob,Mat *AT,int nT,Option *opt)

{
  int iVar1;
  int *piVar2;
  int in_ECX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  bool k_end;
  Mat BT_tile_2;
  Mat AT_tile;
  int max_kk_2;
  int k_2;
  int max_jj_2;
  int j_2;
  int max_ii;
  Mat top_tile;
  int i;
  int ppj_2;
  Mat top_tileX;
  Mat BT_tile_1;
  Mat B_tile_1;
  int max_kk_1;
  int max_jj_1;
  int k_1;
  int j_1;
  int ppk_1;
  int ppj_1;
  int ppjk_1;
  Mat B_tileX;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  Mat B_tile;
  int nn_NK;
  Mat BT;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int B;
  int K;
  int N;
  int M;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outh;
  int outw;
  Mat *m_5;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_4;
  int in_stack_000016f0;
  int in_stack_000016f8;
  undefined8 in_stack_fffffffffffff068;
  int iVar3;
  int in_stack_fffffffffffff070;
  undefined4 in_stack_fffffffffffff074;
  undefined4 in_stack_fffffffffffff078;
  undefined4 in_stack_fffffffffffff07c;
  int in_stack_fffffffffffff080;
  int in_stack_fffffffffffff084;
  int in_stack_fffffffffffff088;
  int in_stack_fffffffffffff08c;
  Mat *in_stack_fffffffffffff090;
  void **ppvVar4;
  int in_stack_fffffffffffff098;
  int in_stack_fffffffffffff09c;
  Mat *in_stack_fffffffffffff0a0;
  int *in_stack_fffffffffffff0d0;
  int *in_stack_fffffffffffff0d8;
  int *in_stack_fffffffffffff0e0;
  undefined8 in_stack_fffffffffffff0e8;
  int K_00;
  Allocator *in_stack_fffffffffffff0f0;
  int in_stack_fffffffffffff100;
  bool local_e99;
  bool local_e01;
  bool local_d91;
  bool local_d6a;
  int in_stack_fffffffffffff298;
  int in_stack_fffffffffffff29c;
  int in_stack_fffffffffffff2a0;
  int in_stack_fffffffffffff2a4;
  Mat *in_stack_fffffffffffff2a8;
  undefined4 uVar5;
  Mat *in_stack_fffffffffffff2b0;
  void *local_d20;
  int *local_d18;
  undefined4 local_d08;
  long *local_d00;
  undefined4 local_cf8;
  int local_cf4;
  int local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  long local_ce0;
  undefined8 local_cd8;
  undefined8 local_cd0;
  undefined8 local_cc8;
  undefined4 local_cc0;
  long *local_cb8;
  undefined4 local_cb0;
  undefined4 local_cac;
  undefined4 local_ca8;
  undefined4 local_ca4;
  undefined4 local_ca0;
  undefined8 local_c98;
  void *local_c90;
  int *local_c88;
  long local_c80;
  undefined4 local_c78;
  long *local_c70;
  undefined4 local_c68;
  int local_c64;
  int local_c60;
  undefined4 local_c5c;
  undefined4 local_c58;
  long local_c50;
  int local_c48;
  int local_c44;
  int local_c40;
  int local_c3c;
  int local_c38;
  int local_c34;
  int local_c30;
  int local_c2c;
  void *local_c28;
  int *local_c20;
  ulong local_c18;
  undefined4 local_c10;
  long *local_c08;
  int local_c00;
  int local_bfc;
  int local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  ulong local_be8;
  int local_be0;
  int local_bdc;
  void *local_bd8;
  int *local_bd0;
  ulong local_bc8;
  undefined4 local_bc0;
  long *local_bb8;
  int local_bb0;
  int local_bac;
  int local_ba8;
  undefined4 local_ba4;
  int local_ba0;
  long local_b98;
  undefined8 local_b90;
  undefined8 local_b88;
  undefined8 local_b80;
  undefined4 local_b78;
  long *local_b70;
  undefined4 local_b68;
  undefined4 local_b64;
  undefined4 local_b60;
  undefined4 local_b5c;
  undefined4 local_b58;
  undefined8 local_b50;
  Mat *local_b48;
  int *local_b40;
  Mat *local_b38;
  int local_b30;
  long *local_b28;
  undefined4 local_b20;
  int local_b1c;
  int local_b18;
  undefined4 local_b14;
  undefined4 local_b10;
  long local_b08;
  void *local_b00;
  int *local_af8;
  ulong local_af0;
  undefined4 local_ae8;
  long *local_ae0;
  int local_ad8;
  int local_ad4;
  int local_ad0;
  undefined4 local_acc;
  undefined4 local_ac8;
  ulong local_ac0;
  int local_ab4;
  int local_ab0;
  int local_aac;
  int local_aa8;
  int local_aa4;
  int local_aa0;
  int local_a9c;
  int local_a98;
  int local_a94;
  void *local_a90;
  int *local_a88;
  ulong local_a80;
  undefined4 local_a78;
  long *local_a70;
  int local_a68;
  int local_a64;
  int local_a60;
  undefined4 local_a5c;
  int local_a58;
  long local_a50;
  undefined8 local_a48;
  undefined8 local_a40;
  undefined8 local_a38;
  undefined4 local_a30;
  long *local_a28;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined8 local_a08;
  Mat *local_a00;
  int *local_9f8;
  Mat *local_9f0;
  int local_9e8;
  long *local_9e0;
  undefined4 local_9d8;
  int local_9d4;
  int local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  long local_9c0;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c;
  int local_998;
  int local_994;
  void *local_990;
  int *local_988;
  undefined8 local_980;
  undefined4 local_978;
  long *local_970;
  undefined4 local_968;
  undefined4 local_964;
  undefined4 local_960;
  undefined4 local_95c;
  int local_958;
  long local_950;
  int local_944;
  int local_940;
  void *local_930;
  int *local_928;
  Mat *local_920;
  int local_918;
  long *local_910;
  undefined4 local_908;
  int local_904;
  int local_900;
  undefined4 local_8fc;
  int local_8f8;
  long local_8f0;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  undefined4 local_8cc;
  int local_8c8;
  int local_8c4;
  int local_8c0;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  int local_8b0;
  int local_8ac;
  int local_89c;
  long *local_898;
  long local_890;
  long local_888;
  int local_87c;
  undefined1 local_875;
  int local_874;
  void **local_870;
  undefined1 *local_868;
  undefined1 local_85d;
  int local_85c;
  void **local_858;
  void **local_850;
  undefined1 local_845;
  int local_844;
  void **local_840;
  undefined8 *local_838;
  undefined1 local_82d;
  int local_82c;
  void **local_828;
  void **local_820;
  undefined1 local_815;
  int local_814;
  void **local_810;
  undefined8 *local_808;
  undefined8 *local_7d8;
  Mat **local_7c8;
  void **local_7b8;
  undefined8 *local_7a8;
  Mat **local_798;
  void **local_788;
  void **local_778;
  undefined8 *local_768;
  undefined1 *local_758;
  void **local_748;
  void **local_738;
  void **local_728;
  void **local_718;
  void **local_708;
  undefined1 local_6f5;
  int local_6f4;
  undefined8 *local_6e8;
  long *local_6d8;
  undefined4 local_6cc;
  long local_6c8;
  long local_6c0;
  undefined4 local_6b4;
  int local_6b0;
  int local_6ac;
  undefined8 *local_6a8;
  long *in_stack_fffffffffffff960;
  int in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  Mat *in_stack_fffffffffffff970;
  Mat *in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  int in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9dc;
  Mat *in_stack_fffffffffffff9e0;
  Mat *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  int in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  undefined8 *in_stack_fffffffffffffa00;
  Mat *in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  
  K_00 = (int)((ulong)in_stack_fffffffffffff0e8 >> 0x20);
  local_89c = in_ECX;
  local_898 = in_RDX;
  local_890 = in_RSI;
  local_888 = in_RDI;
  iVar1 = cpu_support_x86_avx_vnni();
  iVar3 = (int)((ulong)in_stack_fffffffffffff068 >> 0x20);
  if (iVar1 == 0) {
    iVar1 = cpu_support_x86_avx2();
    if (iVar1 == 0) {
      local_8ac = *(int *)(local_890 + 0x2c);
      local_8b0 = *(int *)(local_890 + 0x30);
      local_8b4 = (local_8ac + 3) / 4;
      local_8b8 = (local_8b0 + 3) / 4;
      local_8c4 = local_8b4 * local_8b8;
      local_8c0 = *(int *)(local_890 + 0x38) * *(int *)(local_890 + 0x18);
      local_8c8 = *(int *)(local_888 + 0x38) * *(int *)(local_888 + 0x18);
      local_8cc = 0x24;
      local_8bc = local_8c4;
      get_optimal_tile_mnk_int8
                ((int)((ulong)in_stack_fffffffffffff0f0 >> 0x20),(int)in_stack_fffffffffffff0f0,K_00
                 ,in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0,
                 in_stack_fffffffffffff100);
      local_8dc = (local_8c0 + local_8d0 + -1) / local_8d0;
      local_8e0 = (local_8c4 + local_8d4 + -1) / local_8d4;
      local_8e4 = (local_8c8 + local_8d8 + -1) / local_8d8;
      local_930 = (void *)0x0;
      local_928 = (int *)0x0;
      local_920 = (Mat *)0x0;
      local_918 = 0;
      local_910 = (long *)0x0;
      local_908 = 0;
      local_904 = 0;
      local_900 = 0;
      local_8fc = 0;
      local_8f8 = 0;
      local_8f0 = 0;
      Mat::create(in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088,
                  in_stack_fffffffffffff084,in_stack_fffffffffffff080,
                  CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                  in_stack_fffffffffffff0f0);
      local_d6a = local_930 == (void *)0x0 || local_8f0 * local_8f8 == 0;
      if (local_d6a) {
        local_87c = -100;
        local_940 = 1;
      }
      else {
        local_944 = local_8e0 * local_8e4;
        if ((local_89c < 2) || (local_89c <= local_944)) {
          local_a90 = (void *)0x0;
          local_a88 = (int *)0x0;
          local_a80 = 0;
          local_a78 = 0;
          local_a70 = (long *)0x0;
          local_a68 = 0;
          local_a64 = 0;
          local_a60 = 0;
          local_a5c = 0;
          local_a58 = 0;
          local_a50 = 0;
          Mat::create(in_stack_fffffffffffff0a0,in_stack_fffffffffffff09c,in_stack_fffffffffffff098,
                      (int)((ulong)in_stack_fffffffffffff090 >> 0x20),
                      CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080));
          iVar1 = (int)((ulong)in_stack_fffffffffffff090 >> 0x20);
          local_e01 = local_a90 == (void *)0x0 || local_a50 * local_a58 == 0;
          if (local_e01) {
            local_87c = -100;
            local_940 = 1;
          }
          else {
            for (local_a94 = 0; iVar1 = (int)((ulong)in_stack_fffffffffffff090 >> 0x20),
                local_a94 < local_944; local_a94 = local_a94 + 1) {
              local_a98 = local_a94 / local_8e4;
              local_a9c = local_a94 % local_8e4;
              local_aa0 = local_a98 * local_8d4;
              local_aa4 = local_a9c * local_8d8;
              local_aac = local_8c4 - local_aa0;
              piVar2 = std::min<int>(&local_aac,&local_8d4);
              local_aa8 = *piVar2;
              local_ab4 = local_8c8 - local_aa4;
              piVar2 = std::min<int>(&local_ab4,&local_8d8);
              local_ab0 = *piVar2;
              local_82c = get_omp_thread_num();
              local_820 = &local_b00;
              local_828 = &local_a90;
              local_b00 = (void *)((long)local_a90 + local_a50 * local_82c * local_a80);
              local_af8 = (int *)0x0;
              local_af0 = local_a80;
              local_ae8 = local_a78;
              local_ae0 = local_a70;
              local_ad4 = local_a64;
              local_ad0 = local_a60;
              local_acc = 1;
              local_ac8 = local_a5c;
              local_ac0 = ((long)local_a64 * (long)local_a60 * local_a80 + 0xf & 0xfffffffffffffff0)
                          / local_a80;
              local_ad8 = local_a68 + -1;
              if (local_a68 == 4) {
                local_ac0 = (long)local_a64 * (long)local_a60;
              }
              local_82d = 1;
              conv3x3s1_winograd43_transform_input_tile_int8
                        ((Mat *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                         in_stack_fffffffffffffa08,(int)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                         (int)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                         in_stack_fffffffffffff9f8,in_stack_fffffffffffff070);
              local_844 = local_aa0 / local_8d4;
              local_838 = &local_b90;
              local_840 = &local_930;
              in_stack_fffffffffffff9e8 =
                   (Mat *)((long)local_930 + local_8f0 * local_844 * (long)local_920);
              in_stack_fffffffffffffa00 = &local_b90;
              local_b48 = (Mat *)((long)&in_stack_fffffffffffff9e8->data +
                                 (long)local_904 * (long)local_900 * (long)(local_aa4 / local_8d8) *
                                 (long)local_920);
              local_b08 = (long)local_904 * (long)local_900;
              local_7a8 = &local_b90;
              local_b10 = 1;
              local_b14 = 1;
              local_b18 = local_900;
              local_b1c = local_904;
              local_b20 = 2;
              local_b28 = local_910;
              local_b30 = local_918;
              local_b38 = local_920;
              local_b40 = (int *)0x0;
              local_b70 = local_910;
              local_845 = 1;
              local_b90 = 0;
              local_b80 = 0;
              local_b78 = 0;
              local_b68 = 0;
              local_b64 = 0;
              local_b60 = 0;
              local_b5c = 0;
              local_b58 = 0;
              local_b50 = 0;
              local_b88 = 0;
              in_stack_fffffffffffff9dc = local_918;
              in_stack_fffffffffffff9e0 = local_920;
              in_stack_fffffffffffff9f4 = local_8fc;
              in_stack_fffffffffffff9f8 = local_900;
              in_stack_fffffffffffff9fc = local_904;
              transpose_pack_B_tile_int8
                        (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
                         in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0,
                         in_stack_fffffffffffff29c,in_stack_fffffffffffff298);
              local_798 = &local_b48;
              if (local_b40 != (int *)0x0) {
                LOCK();
                iVar1 = *local_b40;
                *local_b40 = *local_b40 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (local_b28 == (long *)0x0) {
                    if (local_b48 != (Mat *)0x0) {
                      free(local_b48);
                    }
                  }
                  else {
                    (**(code **)(*local_b28 + 0x18))(local_b28,local_b48);
                  }
                }
              }
              local_b48 = (Mat *)0x0;
              local_b38 = (Mat *)0x0;
              local_b30 = 0;
              local_b20 = 0;
              local_b1c = 0;
              local_b18 = 0;
              local_b14 = 0;
              local_b10 = 0;
              local_b08 = 0;
              local_b40 = (int *)0x0;
              local_788 = &local_b00;
              if (local_af8 != (int *)0x0) {
                LOCK();
                iVar1 = *local_af8;
                *local_af8 = *local_af8 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (local_ae0 == (long *)0x0) {
                    if (local_b00 != (void *)0x0) {
                      free(local_b00);
                    }
                  }
                  else {
                    (**(code **)(*local_ae0 + 0x18))(local_ae0,local_b00);
                  }
                }
              }
              local_b00 = (void *)0x0;
              local_af0 = 0;
              local_ae8 = 0;
              local_ad8 = 0;
              local_ad4 = 0;
              local_ad0 = 0;
              local_acc = 0;
              local_ac8 = 0;
              local_ac0 = 0;
              local_af8 = (int *)0x0;
            }
            local_940 = 0;
          }
          local_778 = &local_a90;
          if (local_a88 != (int *)0x0) {
            LOCK();
            iVar3 = *local_a88;
            *local_a88 = *local_a88 + -1;
            UNLOCK();
            if (iVar3 == 1) {
              if (local_a70 == (long *)0x0) {
                if (local_a90 != (void *)0x0) {
                  free(local_a90);
                }
              }
              else {
                (**(code **)(*local_a70 + 0x18))(local_a70,local_a90);
              }
            }
          }
          local_a90 = (void *)0x0;
          local_a80 = 0;
          local_a78 = 0;
          local_a68 = 0;
          local_a64 = 0;
          local_a60 = 0;
          local_a5c = 0;
          local_a58 = 0;
          local_a50 = 0;
          local_a88 = (int *)0x0;
        }
        else {
          local_990 = (void *)0x0;
          local_988 = (int *)0x0;
          local_980 = 0;
          local_978 = 0;
          local_970 = (long *)0x0;
          local_968 = 0;
          local_964 = 0;
          local_960 = 0;
          local_95c = 0;
          local_958 = 0;
          local_950 = 0;
          Mat::create(in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
                      CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
          iVar1 = (int)((ulong)in_stack_fffffffffffff090 >> 0x20);
          local_d91 = local_990 == (void *)0x0 || local_950 * local_958 == 0;
          if (local_d91) {
            local_87c = -100;
            local_940 = 1;
          }
          else {
            for (local_994 = 0; iVar1 = (int)((ulong)in_stack_fffffffffffff090 >> 0x20),
                local_994 < local_944; local_994 = local_994 + 1) {
              local_998 = local_994 / local_8e4;
              local_99c = local_994 % local_8e4;
              local_9a0 = local_998 * local_8d4;
              local_9a4 = local_99c * local_8d8;
              local_9ac = local_8c4 - local_9a0;
              piVar2 = std::min<int>(&local_9ac,&local_8d4);
              local_9a8 = *piVar2;
              local_9b4 = local_8c8 - local_9a4;
              piVar2 = std::min<int>(&local_9b4,&local_8d8);
              local_9b0 = *piVar2;
              conv3x3s1_winograd43_transform_input_tile_int8
                        ((Mat *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                         in_stack_fffffffffffffa08,(int)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                         (int)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                         in_stack_fffffffffffff9f8,in_stack_fffffffffffff070);
              local_814 = local_9a0 / local_8d4;
              local_808 = &local_a48;
              local_810 = &local_930;
              in_stack_fffffffffffff978 =
                   (Mat *)((long)local_930 + local_8f0 * local_814 * (long)local_920);
              local_a00 = (Mat *)((long)&in_stack_fffffffffffff978->data +
                                 (long)local_904 * (long)local_900 * (long)(local_9a4 / local_8d8) *
                                 (long)local_920);
              local_9c0 = (long)local_904 * (long)local_900;
              local_7d8 = &local_a48;
              local_9c8 = 1;
              local_9cc = 1;
              local_9d0 = local_900;
              local_9d4 = local_904;
              local_9d8 = 2;
              local_9e0 = local_910;
              local_9e8 = local_918;
              local_9f0 = local_920;
              local_9f8 = (int *)0x0;
              local_a28 = local_910;
              local_815 = 1;
              local_a48 = 0;
              local_a38 = 0;
              local_a30 = 0;
              local_a20 = 0;
              local_a1c = 0;
              local_a18 = 0;
              local_a14 = 0;
              local_a10 = 0;
              local_a08 = 0;
              local_a40 = 0;
              in_stack_fffffffffffff960 = local_910;
              in_stack_fffffffffffff96c = local_918;
              in_stack_fffffffffffff970 = local_920;
              in_stack_fffffffffffff984 = local_8fc;
              transpose_pack_B_tile_int8
                        (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
                         in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0,
                         in_stack_fffffffffffff29c,in_stack_fffffffffffff298);
              local_7c8 = &local_a00;
              if (local_9f8 != (int *)0x0) {
                LOCK();
                iVar1 = *local_9f8;
                *local_9f8 = *local_9f8 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (local_9e0 == (long *)0x0) {
                    if (local_a00 != (Mat *)0x0) {
                      free(local_a00);
                    }
                  }
                  else {
                    (**(code **)(*local_9e0 + 0x18))(local_9e0,local_a00);
                  }
                }
              }
              local_a00 = (Mat *)0x0;
              local_9f0 = (Mat *)0x0;
              local_9e8 = 0;
              local_9d8 = 0;
              local_9d4 = 0;
              local_9d0 = 0;
              local_9cc = 0;
              local_9c8 = 0;
              local_9c0 = 0;
              local_9f8 = (int *)0x0;
            }
            local_940 = 0;
          }
          local_7b8 = &local_990;
          if (local_988 != (int *)0x0) {
            LOCK();
            iVar3 = *local_988;
            *local_988 = *local_988 + -1;
            UNLOCK();
            if (iVar3 == 1) {
              if (local_970 == (long *)0x0) {
                if (local_990 != (void *)0x0) {
                  free(local_990);
                }
              }
              else {
                (**(code **)(*local_970 + 0x18))(local_970,local_990);
              }
            }
          }
          local_990 = (void *)0x0;
          local_980 = 0;
          local_978 = 0;
          local_968 = 0;
          local_964 = 0;
          local_960 = 0;
          local_95c = 0;
          local_958 = 0;
          local_950 = 0;
          local_988 = (int *)0x0;
        }
        if (local_940 == 0) {
          local_bd8 = (void *)0x0;
          local_bd0 = (int *)0x0;
          local_bc8 = 0;
          local_bc0 = 0;
          local_bb8 = (long *)0x0;
          local_bb0 = 0;
          local_bac = 0;
          local_ba8 = 0;
          local_ba4 = 0;
          local_ba0 = 0;
          local_b98 = 0;
          Mat::create(in_stack_fffffffffffff0a0,in_stack_fffffffffffff09c,in_stack_fffffffffffff098,
                      iVar1,CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080));
          local_e99 = local_bd8 == (void *)0x0 || local_b98 * local_ba0 == 0;
          if (local_e99) {
            local_87c = -100;
          }
          else {
            for (local_bdc = 0; local_bdc < local_8dc; local_bdc = local_bdc + 1) {
              local_be0 = local_bdc * local_8d0;
              local_85c = get_omp_thread_num();
              local_850 = &local_c28;
              local_858 = &local_bd8;
              local_c28 = (void *)((long)local_bd8 + local_b98 * local_85c * local_bc8);
              local_c20 = (int *)0x0;
              local_c18 = local_bc8;
              local_c10 = local_bc0;
              local_c08 = local_bb8;
              local_bfc = local_bac;
              local_bf8 = local_ba8;
              local_bf4 = 1;
              local_bf0 = local_ba4;
              local_be8 = ((long)local_bac * (long)local_ba8 * local_bc8 + 0xf & 0xfffffffffffffff0)
                          / local_bc8;
              local_c00 = local_bb0 + -1;
              if (local_bb0 == 4) {
                local_be8 = (long)local_bac * (long)local_ba8;
              }
              local_85d = 1;
              local_c30 = local_8c0 - local_be0;
              piVar2 = std::min<int>(&local_c30,&local_8d0);
              local_c2c = *piVar2;
              for (local_c34 = 0; local_c34 < local_8c4; local_c34 = local_8d4 + local_c34) {
                local_c3c = local_8c4 - local_c34;
                piVar2 = std::min<int>(&local_c3c,&local_8d4);
                local_c38 = *piVar2;
                for (local_c40 = 0; local_c40 < local_8c8; local_c40 = local_8d8 + local_c40) {
                  local_c48 = local_8c8 - local_c40;
                  piVar2 = std::min<int>(&local_c48,&local_8d8);
                  local_c44 = *piVar2;
                  local_6f4 = local_be0 / local_8d0;
                  local_6e8 = &local_cd8;
                  local_6ac = *(int *)((long)local_898 + 0x2c);
                  local_6b0 = (int)local_898[6];
                  local_6b4 = *(undefined4 *)((long)local_898 + 0x34);
                  local_6c0 = *local_898 + local_898[8] * (long)local_6f4 * local_898[2];
                  local_6c8 = local_898[2];
                  local_6cc = (undefined4)local_898[3];
                  local_6d8 = (long *)local_898[4];
                  local_6a8 = &local_cd8;
                  local_c90 = (void *)(local_6c0 +
                                      (long)local_6ac * (long)local_6b0 *
                                      (long)(local_c40 / local_8d8) * local_6c8);
                  local_c50 = (long)local_6ac * (long)local_6b0;
                  local_768 = &local_cd8;
                  local_874 = local_c34 / local_8d4;
                  local_868 = &stack0xfffffffffffff298;
                  local_870 = &local_930;
                  local_d20 = (void *)((long)local_930 +
                                      (long)local_904 * (long)local_900 *
                                      (long)(local_c40 / local_8d8) * (long)local_920 +
                                      local_8f0 * local_874 * (long)local_920);
                  local_d08 = SUB84(in_stack_fffffffffffff2b0,0);
                  local_ce0 = (long)local_904 * (long)local_900;
                  local_758 = &stack0xfffffffffffff298;
                  local_c58 = 1;
                  local_c5c = 1;
                  local_c68 = 2;
                  local_c88 = (int *)0x0;
                  local_ca0 = 0;
                  local_ca4 = 0;
                  local_ca8 = 0;
                  local_cac = 0;
                  local_cc0 = 0;
                  local_cc8 = 0;
                  local_cd0 = 0;
                  local_cd8 = 0;
                  local_ce8 = 1;
                  local_cec = 1;
                  local_cf0 = local_900;
                  local_cf4 = local_904;
                  local_cf8 = 2;
                  local_d00 = local_910;
                  local_d18 = (int *)0x0;
                  local_6f5 = 1;
                  local_875 = 1;
                  local_c98 = 0;
                  local_cb0 = 0;
                  uVar5 = 0;
                  local_cb8 = local_6d8;
                  local_c80 = local_6c8;
                  local_c78 = local_6cc;
                  local_c70 = local_6d8;
                  local_c64 = local_6ac;
                  local_c60 = local_6b0;
                  gemm_transB_packed_tile_int8
                            ((Mat *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                             in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                             in_stack_fffffffffffff96c,in_stack_fffffffffffff968,
                             (int)((ulong)in_stack_fffffffffffff960 >> 0x20),in_stack_000016f0,
                             in_stack_000016f8,SUB81((ulong)in_stack_fffffffffffff960 >> 0x18,0));
                  ppvVar4 = &local_d20;
                  local_748 = ppvVar4;
                  if (local_d18 != (int *)0x0) {
                    LOCK();
                    iVar1 = *local_d18;
                    *local_d18 = *local_d18 + -1;
                    UNLOCK();
                    if (iVar1 == 1) {
                      if (local_d00 == (long *)0x0) {
                        if (local_d20 != (void *)0x0) {
                          free(local_d20);
                        }
                      }
                      else {
                        (**(code **)(*local_d00 + 0x18))(local_d00,local_d20);
                      }
                    }
                  }
                  *ppvVar4 = (void *)0x0;
                  ppvVar4[2] = (void *)0x0;
                  *(undefined4 *)(ppvVar4 + 3) = 0;
                  *(undefined4 *)(ppvVar4 + 5) = 0;
                  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
                  *(undefined4 *)(ppvVar4 + 6) = 0;
                  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
                  *(undefined4 *)(ppvVar4 + 7) = 0;
                  ppvVar4[8] = (void *)0x0;
                  ppvVar4[1] = (void *)0x0;
                  local_738 = &local_c90;
                  if (local_c88 != (int *)0x0) {
                    LOCK();
                    iVar1 = *local_c88;
                    *local_c88 = *local_c88 + -1;
                    UNLOCK();
                    if (iVar1 == 1) {
                      if (local_c70 == (long *)0x0) {
                        if (local_c90 != (void *)0x0) {
                          free(local_c90);
                        }
                      }
                      else {
                        (**(code **)(*local_c70 + 0x18))(local_c70,local_c90);
                      }
                    }
                  }
                  local_c90 = (void *)0x0;
                  local_c80 = 0;
                  local_c78 = 0;
                  local_c68 = 0;
                  local_c64 = 0;
                  local_c60 = 0;
                  local_c5c = 0;
                  local_c58 = 0;
                  local_c50 = 0;
                  local_c88 = (int *)0x0;
                }
                conv3x3s1_winograd43_transform_output_tile_int8
                          ((Mat *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                           in_stack_fffffffffffff9e8,(int)((ulong)in_stack_fffffffffffff9e0 >> 0x20)
                           ,(int)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                           in_stack_fffffffffffff9d8);
              }
              local_728 = &local_c28;
              if (local_c20 != (int *)0x0) {
                LOCK();
                iVar1 = *local_c20;
                *local_c20 = *local_c20 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (local_c08 == (long *)0x0) {
                    if (local_c28 != (void *)0x0) {
                      free(local_c28);
                    }
                  }
                  else {
                    (**(code **)(*local_c08 + 0x18))(local_c08,local_c28);
                  }
                }
              }
              local_c28 = (void *)0x0;
              local_c18 = 0;
              local_c10 = 0;
              local_c00 = 0;
              local_bfc = 0;
              local_bf8 = 0;
              local_bf4 = 0;
              local_bf0 = 0;
              local_be8 = 0;
              local_c20 = (int *)0x0;
            }
            local_87c = 0;
          }
          local_940 = 1;
          ppvVar4 = &local_bd8;
          local_718 = ppvVar4;
          if (local_bd0 != (int *)0x0) {
            LOCK();
            iVar1 = *local_bd0;
            *local_bd0 = *local_bd0 + -1;
            UNLOCK();
            if (iVar1 == 1) {
              if (local_bb8 == (long *)0x0) {
                if (local_bd8 != (void *)0x0) {
                  free(local_bd8);
                }
              }
              else {
                (**(code **)(*local_bb8 + 0x18))(local_bb8,local_bd8);
              }
            }
          }
          *ppvVar4 = (void *)0x0;
          ppvVar4[2] = (void *)0x0;
          *(undefined4 *)(ppvVar4 + 3) = 0;
          *(undefined4 *)(ppvVar4 + 5) = 0;
          *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
          *(undefined4 *)(ppvVar4 + 6) = 0;
          *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
          *(undefined4 *)(ppvVar4 + 7) = 0;
          ppvVar4[8] = (void *)0x0;
          ppvVar4[1] = (void *)0x0;
        }
      }
      ppvVar4 = &local_930;
      if (local_928 != (int *)0x0) {
        LOCK();
        iVar1 = *local_928;
        *local_928 = *local_928 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          local_708 = ppvVar4;
          if (local_910 == (long *)0x0) {
            if (local_930 != (void *)0x0) {
              free(local_930);
            }
          }
          else {
            (**(code **)(*local_910 + 0x18))(local_910,local_930);
          }
        }
      }
      *ppvVar4 = (void *)0x0;
      ppvVar4[2] = (void *)0x0;
      *(undefined4 *)(ppvVar4 + 3) = 0;
      *(undefined4 *)(ppvVar4 + 5) = 0;
      *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
      *(undefined4 *)(ppvVar4 + 6) = 0;
      *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
      *(undefined4 *)(ppvVar4 + 7) = 0;
      ppvVar4[8] = (void *)0x0;
      ppvVar4[1] = (void *)0x0;
    }
    else {
      local_87c = conv3x3s1_winograd43_int8_avx2
                            ((Mat *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                             (Mat *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                             (Mat *)CONCAT44(in_stack_fffffffffffff074,in_stack_fffffffffffff070),
                             iVar3,(Option *)0x9125f6);
    }
  }
  else {
    local_87c = conv3x3s1_winograd43_int8_avxvnni
                          ((Mat *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                           (Mat *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                           (Mat *)CONCAT44(in_stack_fffffffffffff074,in_stack_fffffffffffff070),
                           iVar3,(Option *)0x9125b4);
  }
  return local_87c;
}

Assistant:

static int conv3x3s1_winograd43_int8(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int nT, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        return conv3x3s1_winograd43_int8_avx512vnni(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        return conv3x3s1_winograd43_int8_avxvnni(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        return conv3x3s1_winograd43_int8_avx2(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__ && !__AVX2__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_xop())
    {
        return conv3x3s1_winograd43_int8_xop(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 4n+2, winograd F(4,3)
    int w_tiles = (outw + 3) / 4;
    int h_tiles = (outh + 3) / 4;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 36;

    // NCNN_LOGE("conv3x3s1_winograd43_int8 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk_int8(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);
        if (B_tile.empty())
            return -100;

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd43_transform_input_tile_int8(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile_int8(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);
        if (B_tileX.empty())
            return -100;

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd43_transform_input_tile_int8(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile_int8(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (top_tileX.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                bool k_end = k + TILE_K >= K;

                gemm_transB_packed_tile_int8(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk, k_end);
            }

            // transform output
            conv3x3s1_winograd43_transform_output_tile_int8(top_tile, top_blob, i, max_ii, j, max_jj);
        }
    }

    return 0;
}